

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error
PVG_FT_Stroker_CubicTo
          (PVG_FT_Stroker stroker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,PVG_FT_Vector *to)

{
  PVG_FT_Pos PVar1;
  ulong angle1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  PVG_FT_Angle PVar5;
  PVG_FT_Angle PVar6;
  PVG_FT_Angle PVar7;
  PVG_FT_Angle PVar8;
  PVG_FT_Fixed PVar9;
  ulong uVar10;
  PVG_FT_Fixed PVar11;
  PVG_FT_Long PVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  PVG_FT_StrokeBorder border;
  long dx;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  PVG_FT_Vector end;
  PVG_FT_Vector start;
  PVG_FT_Vector bez_stack [37];
  PVG_FT_Pos *local_370;
  PVG_FT_Vector local_358;
  PVG_FT_Vector *local_340;
  PVG_FT_Angle local_338;
  ulong local_330;
  ulong local_328;
  long lStack_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  PVG_FT_Vector local_2f8;
  PVG_FT_Vector local_2e8;
  PVG_FT_Vector local_2d8;
  long local_2c0;
  long local_2b8;
  PVG_FT_StrokeBorder local_2b0;
  PVG_FT_Vector local_2a8;
  PVG_FT_Vector local_298;
  PVG_FT_Pos local_288 [4];
  PVG_FT_Pos local_268;
  PVG_FT_Pos PStack_260;
  PVG_FT_Pos local_258;
  PVG_FT_Pos PStack_250;
  
  local_340 = &stroker->center;
  if (((((((stroker->center).x - control1->x) + 1U < 3) &&
        (((stroker->center).y - control1->y) + 1U < 3)) && ((control1->x - control2->x) + 1U < 3))
      && (((control1->y - control2->y) + 1U < 3 && ((control2->x - to->x) + 1U < 3)))) &&
     ((control2->y - to->y) + 1U < 3)) {
    PVar1 = to->y;
    local_340->x = to->x;
    (stroker->center).y = PVar1;
  }
  else {
    local_370 = local_288;
    local_288[0] = to->x;
    local_288[1] = to->y;
    local_288[2] = control2->x;
    local_288[3] = control2->y;
    local_268 = control1->x;
    PStack_260 = control1->y;
    local_258 = local_340->x;
    PStack_250 = (stroker->center).y;
    local_2b0 = stroker->borders;
    uVar13 = CONCAT71((int7)((ulong)local_370 >> 8),1);
    uVar17 = 0;
    do {
      uVar2 = stroker->angle_in;
      uVar10 = uVar2;
      angle1 = uVar2;
      if (uVar17 < 0x200) {
        local_328 = CONCAT44(local_328._4_4_,(int)uVar13);
        local_2c0 = local_370[4];
        local_2b8 = local_370[6];
        local_310 = local_370[5];
        local_308 = local_370[7];
        local_300 = local_370[1];
        local_318 = local_370[2];
        lVar15 = local_318 - local_2c0;
        local_330 = local_370[3];
        lVar16 = local_330 - local_310;
        local_338 = *(long *)((long)local_288 + uVar17);
        dx = local_338 - local_318;
        lVar14 = local_300 - local_330;
        bVar18 = 2 < lVar15 + 1U;
        bVar19 = 2 < lVar16 + 1U;
        bVar20 = 2 < dx + 1U;
        bVar21 = 2 < lVar14 + 1U;
        if ((local_310 - local_308) + 1U < 3 && (local_2c0 - local_2b8) + 1U < 3) {
          if (bVar19 || bVar18) {
            angle1 = PVG_FT_Atan2(lVar15,lVar16);
            uVar2 = angle1;
            uVar10 = angle1;
            if (bVar21 || bVar20) {
              uVar10 = PVG_FT_Atan2(dx,lVar14);
            }
          }
          else if (bVar21 || bVar20) {
            angle1 = PVG_FT_Atan2(dx,lVar14);
            uVar2 = angle1;
            uVar10 = angle1;
          }
        }
        else {
          angle1 = PVG_FT_Atan2(local_2c0 - local_2b8,local_310 - local_308);
          if (bVar19 || bVar18) {
            uVar2 = PVG_FT_Atan2(lVar15,lVar16);
            uVar10 = uVar2;
            if (bVar21 || bVar20) {
              uVar10 = PVG_FT_Atan2(dx,lVar14);
            }
          }
          else {
            uVar2 = angle1;
            uVar10 = angle1;
            if (bVar21 || bVar20) {
              uVar10 = PVG_FT_Atan2(dx,lVar14);
              PVar5 = PVG_FT_Angle_Diff(angle1,uVar10);
              uVar2 = PVar5 / 2 + angle1;
            }
          }
        }
        uVar3 = PVG_FT_Angle_Diff(angle1,uVar2);
        uVar13 = -uVar3;
        if (0 < (long)uVar3) {
          uVar13 = uVar3;
        }
        uVar4 = PVG_FT_Angle_Diff(uVar2,uVar10);
        uVar3 = -uVar4;
        if (0 < (long)uVar4) {
          uVar3 = uVar4;
        }
        if ((uVar13 < 0x168000) && (uVar3 < 0x168000)) {
          uVar13 = local_328 & 0xffffffff;
          goto LAB_0013d3cd;
        }
        if (stroker->first_point != '\0') {
          stroker->angle_in = angle1;
        }
        local_370[0xc] = local_2b8;
        lVar14 = local_318 + local_2c0 + local_2b8 + local_2c0;
        local_370[10] = local_2b8 + local_2c0 >> 1;
        lVar15 = local_318 + local_2c0 + local_338 + local_318;
        local_370[8] = lVar14 >> 2;
        local_370[2] = local_338 + local_318 >> 1;
        local_370[4] = lVar15 >> 2;
        local_370[6] = lVar15 + lVar14 >> 3;
        local_370[0xd] = local_308;
        lVar14 = local_330 + local_310 + local_308 + local_310;
        local_370[0xb] = local_308 + local_310 >> 1;
        lVar15 = local_330 + local_310 + local_300 + local_330;
        local_370[9] = lVar14 >> 2;
        local_370[3] = (long)(local_300 + local_330) >> 1;
        local_370[5] = lVar15 >> 2;
        local_370[7] = lVar15 + lVar14 >> 3;
        uVar17 = uVar17 + 0x30;
        uVar13 = local_328 & 0xffffffff;
      }
      else {
LAB_0013d3cd:
        if ((char)uVar13 == '\0') {
          uVar3 = PVG_FT_Angle_Diff(stroker->angle_in,angle1);
          uVar13 = -uVar3;
          if (0 < (long)uVar3) {
            uVar13 = uVar3;
          }
          if (0x5a000 < uVar13) {
            PVar1 = local_370[7];
            local_340->x = local_370[6];
            local_340->y = PVar1;
            stroker->angle_out = angle1;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
            ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
          }
        }
        else if (stroker->first_point == '\0') {
          stroker->angle_out = angle1;
          ft_stroker_process_corner(stroker,0);
        }
        else {
          ft_stroker_subpath_start(stroker,angle1,0);
        }
        PVar5 = PVG_FT_Angle_Diff(angle1,uVar2);
        PVar6 = PVG_FT_Angle_Diff(uVar2,uVar10);
        PVar7 = PVG_FT_Angle_Diff(angle1,uVar2);
        local_330 = uVar10;
        local_328 = uVar2;
        PVar8 = PVG_FT_Angle_Diff(uVar2,uVar10);
        PVar12 = stroker->radius;
        PVar9 = PVG_FT_Cos(PVar5 / 2);
        local_300 = PVG_FT_DivFix(PVar12,PVar9);
        PVar12 = stroker->radius;
        PVar9 = PVG_FT_Cos(PVar6 / 2);
        local_308 = PVG_FT_DivFix(PVar12,PVar9);
        if (stroker->handle_wide_strokes == '\0') {
          local_338 = 0;
        }
        else {
          local_338 = PVG_FT_Atan2(*(long *)((long)local_288 + uVar17) - local_370[6],
                                   local_370[1] - local_370[7]);
        }
        local_310 = PVar7 / 2 + angle1;
        local_318 = PVar8 / 2 + local_328;
        lVar14 = 0x5a0000;
        border = local_2b0;
        bVar18 = true;
        do {
          bVar19 = bVar18;
          PVG_FT_Vector_From_Polar(&local_2d8,local_300,local_310 + lVar14);
          local_2d8.x = local_370[4] + local_2d8.x;
          local_2d8.y = local_370[5] + local_2d8.y;
          PVG_FT_Vector_From_Polar(&local_2e8,local_308,local_318 + lVar14);
          local_2e8.x = local_370[2] + local_2e8.x;
          local_2e8.y = local_370[3] + local_2e8.y;
          PVG_FT_Vector_From_Polar(&local_358,stroker->radius,lVar14 + local_330);
          lVar14 = *(long *)((long)local_288 + uVar17);
          local_358.x = local_358.x + lVar14;
          lVar15 = local_370[1];
          local_358.y = local_358.y + lVar15;
          if (stroker->handle_wide_strokes == '\0') {
LAB_0013d890:
            ft_stroke_border_cubicto(border,&local_2d8,&local_2e8,&local_358);
          }
          else {
            uVar13 = border->points[border->num_points - 1].x;
            lVar16 = border->points[border->num_points - 1].y;
            local_328 = uVar13;
            lStack_320 = lVar16;
            local_2f8.x = uVar13;
            local_2f8.y = lVar16;
            PVar5 = PVG_FT_Atan2(local_358.x - uVar13,local_358.y - lVar16);
            uVar10 = PVG_FT_Angle_Diff(local_338,PVar5);
            uVar2 = -uVar10;
            if (0 < (long)uVar10) {
              uVar2 = uVar10;
            }
            if (uVar2 < 0x5a0001) goto LAB_0013d890;
            PVar6 = PVG_FT_Atan2(local_370[6] - uVar13,local_370[7] - lVar16);
            PVar7 = PVG_FT_Atan2(lVar14 - local_358.x,lVar15 - local_358.y);
            local_298.x = local_358.x - local_328;
            local_298.y = local_358.y - lStack_320;
            PVar9 = PVG_FT_Vector_Length(&local_298);
            PVar11 = PVG_FT_Sin(PVar5 - PVar7);
            lVar14 = -PVar11;
            if (0 < PVar11) {
              lVar14 = PVar11;
            }
            PVar11 = PVG_FT_Sin(PVar6 - PVar7);
            lVar15 = -PVar11;
            if (0 < PVar11) {
              lVar15 = PVar11;
            }
            PVar12 = PVG_FT_MulDiv(PVar9,lVar14,lVar15);
            PVG_FT_Vector_From_Polar(&local_2a8,PVar12,PVar6);
            local_2a8.x = local_328 + local_2a8.x;
            local_2a8.y = lStack_320 + local_2a8.y;
            border->movable = '\0';
            ft_stroke_border_lineto(border,&local_2a8,'\0');
            ft_stroke_border_lineto(border,&local_358,'\0');
            ft_stroke_border_cubicto(border,&local_2e8,&local_2d8,&local_2f8);
            ft_stroke_border_lineto(border,&local_358,'\0');
          }
          border = border + 1;
          lVar14 = -0x5a0000;
          bVar18 = false;
        } while (bVar19);
        uVar17 = uVar17 - 0x30;
        stroker->angle_in = local_330;
        uVar13 = 0;
      }
      local_370 = (PVG_FT_Pos *)((long)local_288 + uVar17);
    } while (-1 < (long)uVar17);
    PVar1 = to->y;
    local_340->x = to->x;
    local_340->y = PVar1;
    stroker->line_length = 0;
  }
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_CubicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control1,
                                  PVG_FT_Vector* control2, PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[37];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 32;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if (PVG_FT_IS_SMALL(stroker->center.x - control1->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control1->y) &&
        PVG_FT_IS_SMALL(control1->x - control2->x) &&
        PVG_FT_IS_SMALL(control1->y - control2->y) &&
        PVG_FT_IS_SMALL(control2->x - to->x) &&
        PVG_FT_IS_SMALL(control2->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_mid, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = angle_mid = stroker->angle_in;

        if (arc < limit &&
            !ft_cubic_is_small_enough(arc, &angle_in, &angle_mid, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_cubic_split(arc);
            arc += 3;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CUBIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[3];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl1, ctrl2, end;
            PVG_FT_Angle        theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
            PVG_FT_Fixed        length1, length2;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta1 = PVG_FT_Angle_Diff(angle_in, angle_mid) / 2;
            theta2 = PVG_FT_Angle_Diff(angle_mid, angle_out) / 2;
            phi1 = ft_angle_mean(angle_in, angle_mid);
            phi2 = ft_angle_mean(angle_mid, angle_out);
            length1 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta1));
            length2 = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta2));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[3].x, arc[0].y - arc[3].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control points */
                PVG_FT_Vector_From_Polar(&ctrl1, length1, phi1 + rotate);
                ctrl1.x += arc[2].x;
                ctrl1.y += arc[2].y;

                PVG_FT_Vector_From_Polar(&ctrl2, length2, phi2 + rotate);
                ctrl2.x += arc[1].x;
                ctrl2.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[3].x - start.x, arc[3].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_cubicto(border, &ctrl2, &ctrl1,
                                                         &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_cubicto(border, &ctrl1, &ctrl2, &end);
                if (error) goto Exit;
            }
        }

        arc -= 3;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}